

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

numeric * __thiscall
cs_impl::
cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::_call<0>(cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  numeric *rhs;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  numeric *in_RDI;
  var *in_stack_000000c0;
  numeric *__args;
  undefined8 in_stack_ffffffffffffffb8;
  
  __args = in_RDI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  ::convert(in_stack_000000c0);
  std::
  function<cs::numeric_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<cs::numeric_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_ffffffffffffffb8,(any *)__args);
  rhs = type_convertor<cs::numeric,_cs::numeric>::convert<cs::numeric>
                  ((numeric *)&stack0xffffffffffffffb8);
  cs::numeric::numeric(in_RDI,rhs);
  return __args;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}